

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::SingleVertexArrayNormalizeGroup::init
          (SingleVertexArrayNormalizeGroup *this,EVP_PKEY_CTX *ctx)

{
  InputType IVar1;
  int t;
  GLValue min_;
  GLValue max_;
  int in_EAX;
  MultiVertexArrayTest *this_00;
  int t_00;
  long lVar2;
  GLValue GVar3;
  GLValue GVar4;
  Spec spec;
  undefined4 uStack_ec;
  undefined4 uStack_dc;
  string name;
  string local_b0;
  string local_90;
  ArraySpec arraySpec;
  
  t_00 = 2;
  do {
    if (t_00 == 5) {
      return in_EAX;
    }
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
      IVar1 = this->m_type;
      if (IVar1 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
        in_EAX = 10;
        if (t_00 == 4) {
LAB_005a8511:
          typeToString<int>(&local_b0,t_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                         "components",&local_b0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arraySpec,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                         "_quads");
          t = *(int *)((long)&DAT_009bd238 + lVar2);
          typeToString<int>(&local_90,t);
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &arraySpec,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&arraySpec);
          std::__cxx11::string::~string((string *)&spec);
          std::__cxx11::string::~string((string *)&local_b0);
          IVar1 = this->m_type;
          GVar3 = deqp::gls::GLValue::getMinValue(IVar1);
          GVar4 = deqp::gls::GLValue::getMaxValue(this->m_type);
          max_._4_4_ = uStack_ec;
          max_.type = GVar4.type;
          min_._4_4_ = uStack_dc;
          min_.type = GVar3.type;
          min_.field_1 = GVar3.field_1;
          max_.field_1 = GVar4.field_1;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&arraySpec,IVar1,OUTPUTTYPE_VEC4,STORAGE_USER,USAGE_DYNAMIC_DRAW,t_00,0,0,true,
                     min_,max_);
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          spec.primitive = PRIMITIVE_TRIANGLES;
          spec.first = 0;
          spec.drawCount = t;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::push_back(&spec.arrays,&arraySpec);
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,&spec,
                     name._M_dataplus._M_p,name._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          std::
          _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::~_Vector_base(&spec.arrays.
                           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         );
          in_EAX = std::__cxx11::string::~string((string *)&name);
        }
      }
      else {
        in_EAX = CONCAT31((int3)(IVar1 >> 8),IVar1 == INPUTTYPE_INT_2_10_10_10);
        if (t_00 == 4 || IVar1 != INPUTTYPE_INT_2_10_10_10) goto LAB_005a8511;
      }
    }
    t_00 = t_00 + 1;
  } while( true );
}

Assistant:

void SingleVertexArrayNormalizeGroup::init (void)
{
	int					counts[]		= {1, 256};

	for (int componentCount = 2; componentCount < 5; componentCount++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
				continue;

			std::string name = "components" + typeToString(componentCount) + "_quads" + typeToString(counts[countNdx]);

			MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
															Array::OUTPUTTYPE_VEC4,
															Array::STORAGE_USER,
															Array::USAGE_DYNAMIC_DRAW,
															componentCount,
															0,
															0,
															true,
															GLValue::getMinValue(m_type),
															GLValue::getMaxValue(m_type));

			MultiVertexArrayTest::Spec spec;
			spec.primitive	= Array::PRIMITIVE_TRIANGLES;
			spec.drawCount	= counts[countNdx];
			spec.first		= 0;
			spec.arrays.push_back(arraySpec);

			addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
		}
	}
}